

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O1

void __thiscall FCompressedFile::Close(FCompressedFile *this)

{
  if (this->m_File != (FILE *)0x0) {
    if (this->m_Mode == EWriting) {
      Implode(this);
      fwrite("FLZL",4,1,(FILE *)this->m_File);
      fwrite(this->m_Buffer,(ulong)(this->m_BufferSize + 8),1,(FILE *)this->m_File);
    }
    fclose((FILE *)this->m_File);
    this->m_File = (FILE *)0x0;
  }
  if (this->m_Buffer != (uchar *)0x0) {
    M_Free(this->m_Buffer);
    this->m_Buffer = (uchar *)0x0;
  }
  this->m_Pos = 0;
  this->m_BufferSize = 0;
  this->m_MaxBufferSize = 0;
  this->m_Buffer = (uchar *)0x0;
  this->m_File = (FILE *)0x0;
  this->m_NoCompress = false;
  this->m_Mode = ENotOpen;
  return;
}

Assistant:

void FCompressedFile::Close ()
{
	if (m_File)
	{
		if (m_Mode == EWriting)
		{
			Implode ();
			fwrite (ZSig, 4, 1, m_File);
			fwrite (m_Buffer, m_BufferSize + 8, 1, m_File);
		}
		fclose (m_File);
		m_File = NULL;
	}
	if (m_Buffer)
	{
		M_Free (m_Buffer);
		m_Buffer = NULL;
	}
	BeEmpty ();
}